

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

void __thiscall CppJieba::MPSegment::MPSegment(MPSegment *this,char *dictPath)

{
  char *in_RSI;
  SegmentBase *in_RDI;
  Trie *in_stack_ffffffffffffffc0;
  allocator local_1d [13];
  char *local_10;
  
  local_10 = in_RSI;
  SegmentBase::SegmentBase(in_RDI);
  (in_RDI->super_ISegment)._vptr_ISegment = (_func_int **)&PTR__MPSegment_00151c38;
  Trie::Trie(in_stack_ffffffffffffffc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[4]._isInited,local_10,local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  return;
}

Assistant:

MPSegment(const char * const dictPath): _dictPath(dictPath){}